

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void mi_segments_track_size(long segment_size,mi_segments_tld_t *tld)

{
  mi_stat_count_t *stat;
  long lVar1;
  ulong uVar2;
  
  stat = &tld->stats->segments;
  if (segment_size < 0) {
    _mi_stat_decrease(stat,1);
    lVar1 = -1;
  }
  else {
    lVar1 = 1;
    _mi_stat_increase(stat,1);
  }
  uVar2 = lVar1 + tld->count;
  tld->count = uVar2;
  if (tld->peak_count < uVar2) {
    tld->peak_count = uVar2;
  }
  uVar2 = segment_size + tld->current_size;
  tld->current_size = uVar2;
  if (tld->peak_size < uVar2) {
    tld->peak_size = uVar2;
  }
  return;
}

Assistant:

static void mi_segments_track_size(long segment_size, mi_segments_tld_t* tld) {
  if (segment_size>=0) _mi_stat_increase(&tld->stats->segments,1);
                  else _mi_stat_decrease(&tld->stats->segments,1);
  tld->count += (segment_size >= 0 ? 1 : -1);
  if (tld->count > tld->peak_count) tld->peak_count = tld->count;
  tld->current_size += segment_size;
  if (tld->current_size > tld->peak_size) tld->peak_size = tld->current_size;
}